

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O3

uint64_t lzma_memusage(lzma_stream *strm)

{
  lzma_internal *plVar1;
  _func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict12 *p_Var2;
  lzma_ret lVar3;
  uint64_t uVar4;
  uint64_t memusage;
  uint64_t old_memlimit;
  uint64_t local_18;
  uint64_t local_10;
  
  if (((strm == (lzma_stream *)0x0) || (plVar1 = strm->internal, plVar1 == (lzma_internal *)0x0)) ||
     (p_Var2 = (plVar1->next).memconfig,
     p_Var2 == (_func_lzma_ret_lzma_coder_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t_conflict12 *)0x0))
  {
    uVar4 = 0;
  }
  else {
    lVar3 = (*p_Var2)((plVar1->next).coder,&local_18,&local_10,0);
    uVar4 = 0;
    if (lVar3 == LZMA_OK) {
      uVar4 = local_18;
    }
  }
  return uVar4;
}

Assistant:

extern LZMA_API(uint64_t)
lzma_memusage(const lzma_stream *strm)
{
	uint64_t memusage;
	uint64_t old_memlimit;

	if (strm == NULL || strm->internal == NULL
			|| strm->internal->next.memconfig == NULL
			|| strm->internal->next.memconfig(
				strm->internal->next.coder,
				&memusage, &old_memlimit, 0) != LZMA_OK)
		return 0;

	return memusage;
}